

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict_manager.cpp
# Opt level: O3

bool __thiscall duckdb::ConflictManager::IsConflict(ConflictManager *this,LookupResultType type)

{
  bool bVar1;
  NotImplementedException *this_00;
  int iVar2;
  undefined7 in_register_00000031;
  string local_40;
  
  iVar2 = (int)CONCAT71(in_register_00000031,type);
  if (iVar2 == 0) {
    bVar1 = false;
  }
  else {
    bVar1 = true;
    if (iVar2 != 1) {
      if (iVar2 != 2) {
        this_00 = (NotImplementedException *)__cxa_allocate_exception(0x10);
        local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"Type not implemented for LookupResultType","");
        NotImplementedException::NotImplementedException(this_00,&local_40);
        __cxa_throw(this_00,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error)
        ;
      }
      bVar1 = ShouldIgnoreNulls(this);
      bVar1 = !bVar1;
    }
  }
  return bVar1;
}

Assistant:

bool ConflictManager::IsConflict(LookupResultType type) {
	switch (type) {
	case LookupResultType::LOOKUP_NULL: {
		if (ShouldIgnoreNulls()) {
			return false;
		}
		// If nulls are not ignored, treat this as a hit instead
		return IsConflict(LookupResultType::LOOKUP_HIT);
	}
	case LookupResultType::LOOKUP_HIT: {
		return true;
	}
	case LookupResultType::LOOKUP_MISS: {
		// FIXME: If we record a miss as a conflict when the verify type is APPEND_FK, then we can simplify the checks
		// in VerifyForeignKeyConstraint This also means we should not record a hit as a conflict when the verify type
		// is APPEND_FK
		return false;
	}
	default: {
		throw NotImplementedException("Type not implemented for LookupResultType");
	}
	}
}